

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

int qt_gl_resolve_extensions(void)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  long in_FS_OFFSET;
  QOpenGLContext *ctx;
  int extensions;
  GLboolean srgbCapableFramebuffers;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensionMatcher;
  undefined4 in_stack_fffffffffffffae8;
  OpenGLExtension in_stack_fffffffffffffaec;
  enum_type in_stack_fffffffffffffaf0;
  byte in_stack_fffffffffffffaf4;
  byte in_stack_fffffffffffffaf5;
  byte in_stack_fffffffffffffaf6;
  byte in_stack_fffffffffffffaf7;
  byte bVar4;
  undefined1 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaf9;
  undefined1 in_stack_fffffffffffffafa;
  undefined1 in_stack_fffffffffffffafb;
  undefined1 in_stack_fffffffffffffafc;
  undefined1 in_stack_fffffffffffffafd;
  undefined1 in_stack_fffffffffffffafe;
  undefined1 in_stack_fffffffffffffaff;
  byte bVar5;
  bool local_4ff;
  bool local_4fb;
  bool local_4eb;
  uint local_4cc;
  QOpenGLExtensionMatcher *in_stack_fffffffffffffb48;
  QByteArray local_4a8;
  QByteArray local_490;
  QByteArray local_478;
  int local_460 [2];
  pair<int,_int> local_458;
  pair<int,_int> local_450;
  int local_448 [2];
  pair<int,_int> local_440;
  pair<int,_int> local_438;
  QByteArray local_430;
  int local_418 [2];
  pair<int,_int> local_410;
  pair<int,_int> local_408;
  QByteArray local_400;
  QByteArray local_3e8;
  QByteArray local_3d0;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_3b4;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_3b0;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_3ac;
  QByteArray local_3a8;
  QByteArray local_390;
  int local_378 [2];
  pair<int,_int> local_370;
  pair<int,_int> local_368;
  int local_360 [2];
  pair<int,_int> local_358;
  pair<int,_int> local_350;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_348;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_344;
  QByteArray local_340;
  QByteArray local_328;
  QByteArray local_310;
  QByteArray local_2f8;
  QByteArray local_2e0;
  QByteArray local_2c8;
  QByteArray local_2b0;
  QByteArray local_298;
  QByteArray local_280;
  QByteArray local_268;
  QByteArray local_250;
  QByteArray local_238;
  QByteArray local_220;
  QByteArray local_208;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1f0;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1ec;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1e8;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1e4;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1e0;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1dc;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1d8;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1d4;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1d0;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_1cc;
  QByteArray local_1c8;
  QByteArray local_1b0;
  QByteArray local_198;
  QByteArray local_180;
  QByteArray local_168;
  QByteArray local_150;
  QByteArray local_138;
  QByteArray local_120;
  QByteArray local_108;
  QByteArray local_f0;
  QByteArray local_d8;
  QByteArray local_c0;
  QByteArray local_a8;
  QByteArray local_90;
  QByteArray local_78;
  QByteArray local_60;
  QByteArray local_48;
  QByteArray local_30;
  QSurfaceFormat local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4cc = 0;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher(in_stack_fffffffffffffb48);
  QOpenGLContext::currentContext();
  local_18.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format
            ((QOpenGLContext *)
             CONCAT17(in_stack_fffffffffffffaff,
                      CONCAT16(in_stack_fffffffffffffafe,
                               CONCAT15(in_stack_fffffffffffffafd,
                                        CONCAT14(in_stack_fffffffffffffafc,
                                                 CONCAT13(in_stack_fffffffffffffafb,
                                                          CONCAT12(in_stack_fffffffffffffafa,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffaf9,
                                                  in_stack_fffffffffffffaf8))))))));
  QByteArray::QByteArray(&local_30,"GL_EXT_bgra",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d498);
  if (bVar1) {
    local_4cc = 0x800;
  }
  QByteArray::QByteArray(&local_48,"GL_ARB_texture_rectangle",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d4f0);
  if (bVar1) {
    local_4cc = local_4cc | 1;
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_texture_compression",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d546);
  if (bVar1) {
    local_4cc = local_4cc | 4;
  }
  QByteArray::QByteArray(&local_78,"GL_EXT_texture_compression_s3tc",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d59c);
  if (bVar1) {
    local_4cc = local_4cc | 0x1000;
  }
  QByteArray::QByteArray(&local_90,"GL_OES_compressed_ETC1_RGB8_texture",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d5f4);
  if (bVar1) {
    local_4cc = local_4cc | 0x2000;
  }
  QByteArray::QByteArray(&local_a8,"GL_IMG_texture_compression_pvrtc",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d64c);
  if (bVar1) {
    local_4cc = local_4cc | 0x4000;
  }
  QByteArray::QByteArray(&local_c0,"GL_KHR_texture_compression_astc_ldr",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d6a4);
  if (bVar1) {
    local_4cc = local_4cc | 0x4000000;
  }
  QByteArray::QByteArray(&local_d8,"GL_ARB_texture_mirrored_repeat",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d6fc);
  if (bVar1) {
    local_4cc = local_4cc | 8;
  }
  QByteArray::QByteArray(&local_f0,"GL_EXT_stencil_two_side",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d752);
  if (bVar1) {
    local_4cc = local_4cc | 0x20;
  }
  QByteArray::QByteArray(&local_108,"GL_EXT_stencil_wrap",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d7a8);
  if (bVar1) {
    local_4cc = local_4cc | 0x40;
  }
  QByteArray::QByteArray(&local_120,"GL_NV_float_buffer",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d7fe);
  if (bVar1) {
    local_4cc = local_4cc | 0x100;
  }
  QByteArray::QByteArray(&local_138,"GL_ARB_pixel_buffer_object",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d856);
  if (bVar1) {
    local_4cc = local_4cc | 0x200;
  }
  QByteArray::QByteArray(&local_150,"GL_ARB_texture_swizzle",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  local_4eb = true;
  if (!bVar1) {
    QByteArray::QByteArray(&local_168,"GL_EXT_texture_swizzle",-1);
    local_4eb = QOpenGLExtensionMatcher::match
                          ((QOpenGLExtensionMatcher *)
                           CONCAT17(in_stack_fffffffffffffaf7,
                                    CONCAT16(in_stack_fffffffffffffaf6,
                                             CONCAT15(in_stack_fffffffffffffaf5,
                                                      CONCAT14(in_stack_fffffffffffffaf4,
                                                               in_stack_fffffffffffffaf0)))),
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90d906);
  }
  QByteArray::~QByteArray((QByteArray *)0x90d913);
  if (local_4eb != false) {
    local_4cc = local_4cc | 0x1000000;
  }
  QByteArray::QByteArray(&local_180,"GL_OES_standard_derivatives",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d96b);
  if (bVar1) {
    local_4cc = local_4cc | 0x2000000;
  }
  QByteArray::QByteArray(&local_198,"GL_ARB_half_float_vertex",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90d9c3);
  if (bVar1) {
    local_4cc = local_4cc | 0x10000000;
  }
  QByteArray::QByteArray(&local_1b0,"GL_OVR_multiview",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90da1b);
  if (bVar1) {
    local_4cc = local_4cc | 0x20000000;
  }
  QByteArray::QByteArray(&local_1c8,"GL_OVR_multiview2",-1);
  bVar1 = QOpenGLExtensionMatcher::match
                    ((QOpenGLExtensionMatcher *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  QByteArray::~QByteArray((QByteArray *)0x90da73);
  if (bVar1) {
    local_4cc = local_4cc | 0x40000000;
  }
  bVar1 = QOpenGLContext::isOpenGLES
                    ((QOpenGLContext *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))));
  if (bVar1) {
    iVar3 = QSurfaceFormat::majorVersion(&local_18);
    if (1 < iVar3) {
      local_4cc = local_4cc | 2;
    }
    iVar3 = QSurfaceFormat::majorVersion(&local_18);
    if (iVar3 < 3) {
      QByteArray::QByteArray(&local_208,"GL_OES_packed_depth_stencil",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dc2f);
      if (bVar1) {
        local_4cc = local_4cc | 0x80;
      }
      QByteArray::QByteArray(&local_220,"GL_OES_depth24",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dc87);
      if (bVar1) {
        local_4cc = local_4cc | 0x10000;
      }
      QByteArray::QByteArray(&local_238,"GL_ANGLE_framebuffer_blit",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dcdf);
      if (bVar1) {
        local_4cc = local_4cc | 0x400;
      }
      QByteArray::QByteArray(&local_250,"GL_ANGLE_framebuffer_multisample",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dd37);
      if (bVar1) {
        local_4cc = local_4cc | 0x10;
      }
      QByteArray::QByteArray(&local_268,"GL_NV_framebuffer_blit",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dd8d);
      if (bVar1) {
        local_4cc = local_4cc | 0x400;
      }
      QByteArray::QByteArray(&local_280,"GL_NV_framebuffer_multisample",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90dde5);
      if (bVar1) {
        local_4cc = local_4cc | 0x10;
      }
      QByteArray::QByteArray(&local_298,"GL_OES_rgb8_rgba8",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90de3b);
      if (bVar1) {
        local_4cc = local_4cc | 0x200000;
      }
      QByteArray::QByteArray(&local_2b0,"GL_OES_compressed_ETC2_RGB8_texture",-1);
      bVar1 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90de93);
      if (bVar1) {
        local_4cc = local_4cc | 0x8000000;
      }
    }
    else {
      local_1f0.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           operator|(CONCAT13(in_stack_fffffffffffffaf7,
                              CONCAT12(in_stack_fffffffffffffaf6,
                                       CONCAT11(in_stack_fffffffffffffaf5,in_stack_fffffffffffffaf4)
                                      )),in_stack_fffffffffffffaf0);
      local_1ec.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1e8.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1e4.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1e0.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1dc.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1d8.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1d4.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1d0.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_1cc.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(in_stack_fffffffffffffaf7,
                               CONCAT16(in_stack_fffffffffffffaf6,
                                        CONCAT15(in_stack_fffffffffffffaf5,
                                                 CONCAT14(in_stack_fffffffffffffaf4,
                                                          in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1cc);
      local_4cc = IVar2 | local_4cc | 0x1000000;
    }
    QByteArray::QByteArray(&local_2c8,"GL_OES_mapbuffer",-1);
    bVar1 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90deed);
    if (bVar1) {
      local_4cc = local_4cc | 0x40000;
    }
    QByteArray::QByteArray(&local_2e0,"GL_OES_element_index_uint",-1);
    bVar1 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90df45);
    if (bVar1) {
      local_4cc = local_4cc | 0x8000;
    }
    QByteArray::QByteArray(&local_2f8,"GL_IMG_texture_format_BGRA8888",-1);
    bVar1 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    local_4fb = true;
    if (!bVar1) {
      QByteArray::QByteArray(&local_310,"GL_EXT_texture_format_BGRA8888",-1);
      local_4fb = QOpenGLExtensionMatcher::match
                            ((QOpenGLExtensionMatcher *)
                             CONCAT17(in_stack_fffffffffffffaf7,
                                      CONCAT16(in_stack_fffffffffffffaf6,
                                               CONCAT15(in_stack_fffffffffffffaf5,
                                                        CONCAT14(in_stack_fffffffffffffaf4,
                                                                 in_stack_fffffffffffffaf0)))),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      QByteArray::~QByteArray((QByteArray *)0x90dff5);
    }
    QByteArray::~QByteArray((QByteArray *)0x90e002);
    if (local_4fb != false) {
      local_4cc = local_4cc | 0x800;
    }
    QByteArray::QByteArray(&local_328,"GL_EXT_discard_framebuffer",-1);
    bVar1 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90e05a);
    if (bVar1) {
      local_4cc = local_4cc | 0x400000;
    }
    QByteArray::QByteArray(&local_340,"GL_EXT_texture_norm16",-1);
    bVar1 = QOpenGLExtensionMatcher::match
                      ((QOpenGLExtensionMatcher *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90e0b2);
    if (bVar1) {
      local_4cc = local_4cc | 0x800000;
    }
  }
  else {
    local_348.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
         (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
         operator|(CONCAT13(in_stack_fffffffffffffaf7,
                            CONCAT12(in_stack_fffffffffffffaf6,
                                     CONCAT11(in_stack_fffffffffffffaf5,in_stack_fffffffffffffaf4)))
                   ,in_stack_fffffffffffffaf0);
    local_344.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
         (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
         QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                   ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                    CONCAT17(in_stack_fffffffffffffaf7,
                             CONCAT16(in_stack_fffffffffffffaf6,
                                      CONCAT15(in_stack_fffffffffffffaf5,
                                               CONCAT14(in_stack_fffffffffffffaf4,
                                                        in_stack_fffffffffffffaf0)))),
                    in_stack_fffffffffffffaec);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_344);
    local_4cc = IVar2 | local_4cc;
    local_350 = QSurfaceFormat::version
                          ((QSurfaceFormat *)
                           CONCAT17(in_stack_fffffffffffffaf7,
                                    CONCAT16(in_stack_fffffffffffffaf6,
                                             CONCAT15(in_stack_fffffffffffffaf5,
                                                      CONCAT14(in_stack_fffffffffffffaf4,
                                                               in_stack_fffffffffffffaf0)))));
    local_360[1] = 1;
    local_360[0] = 2;
    std::pair<int,_int>::pair<int,_int,_true>(&local_358,local_360 + 1,local_360);
    bVar1 = std::operator>=((pair<int,_int> *)
                            CONCAT17(in_stack_fffffffffffffaf7,
                                     CONCAT16(in_stack_fffffffffffffaf6,
                                              CONCAT15(in_stack_fffffffffffffaf5,
                                                       CONCAT14(in_stack_fffffffffffffaf4,
                                                                in_stack_fffffffffffffaf0)))),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (bVar1) {
      local_4cc = local_4cc | 0x800;
    }
    local_368 = QSurfaceFormat::version
                          ((QSurfaceFormat *)
                           CONCAT17(in_stack_fffffffffffffaf7,
                                    CONCAT16(in_stack_fffffffffffffaf6,
                                             CONCAT15(in_stack_fffffffffffffaf5,
                                                      CONCAT14(in_stack_fffffffffffffaf4,
                                                               in_stack_fffffffffffffaf0)))));
    local_378[1] = 1;
    local_378[0] = 4;
    std::pair<int,_int>::pair<int,_int,_true>(&local_370,local_378 + 1,local_378);
    bVar1 = std::operator>=((pair<int,_int> *)
                            CONCAT17(in_stack_fffffffffffffaf7,
                                     CONCAT16(in_stack_fffffffffffffaf6,
                                              CONCAT15(in_stack_fffffffffffffaf5,
                                                       CONCAT14(in_stack_fffffffffffffaf4,
                                                                in_stack_fffffffffffffaf0)))),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    local_4ff = true;
    bVar4 = in_stack_fffffffffffffaf7;
    if (!bVar1) {
      QByteArray::QByteArray(&local_390,"GL_SGIS_generate_mipmap",-1);
      local_4ff = QOpenGLExtensionMatcher::match
                            ((QOpenGLExtensionMatcher *)
                             CONCAT17(in_stack_fffffffffffffaf7,
                                      CONCAT16(in_stack_fffffffffffffaf6,
                                               CONCAT15(in_stack_fffffffffffffaf5,
                                                        CONCAT14(in_stack_fffffffffffffaf4,
                                                                 in_stack_fffffffffffffaf0)))),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      QByteArray::~QByteArray((QByteArray *)0x90e248);
      bVar4 = in_stack_fffffffffffffaf7;
    }
    if (local_4ff != false) {
      local_4cc = local_4cc | 2;
    }
    iVar3 = QSurfaceFormat::majorVersion(&local_18);
    if (1 < iVar3) {
      local_4cc = local_4cc | 0x2000000;
    }
    iVar3 = QSurfaceFormat::majorVersion(&local_18);
    bVar5 = 1;
    if (iVar3 < 3) {
      QByteArray::QByteArray(&local_3a8,"GL_ARB_framebuffer_object",-1);
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                 CONCAT15(in_stack_fffffffffffffaf5,
                                                          CONCAT14(in_stack_fffffffffffffaf4,
                                                                   in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90e2f2);
    }
    if ((bVar5 & 1) == 0) {
      QByteArray::QByteArray(&local_3d0,"GL_EXT_framebuffer_multisample",-1);
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                 CONCAT15(in_stack_fffffffffffffaf5,
                                                          CONCAT14(in_stack_fffffffffffffaf4,
                                                                   in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90e39f);
      if ((bVar5 & 1) != 0) {
        local_4cc = local_4cc | 0x10;
      }
      QByteArray::QByteArray(&local_3e8,"GL_EXT_framebuffer_blit",-1);
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                 CONCAT15(in_stack_fffffffffffffaf5,
                                                          CONCAT14(in_stack_fffffffffffffaf4,
                                                                   in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90e3f5);
      if ((bVar5 & 1) != 0) {
        local_4cc = local_4cc | 0x400;
      }
      QByteArray::QByteArray(&local_400,"GL_EXT_packed_depth_stencil",-1);
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                 CONCAT15(in_stack_fffffffffffffaf5,
                                                          CONCAT14(in_stack_fffffffffffffaf4,
                                                                   in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90e44d);
      if ((bVar5 & 1) != 0) {
        local_4cc = local_4cc | 0x80;
      }
    }
    else {
      local_3b4.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           operator|(CONCAT13(bVar4,CONCAT12(in_stack_fffffffffffffaf6,
                                             CONCAT11(in_stack_fffffffffffffaf5,
                                                      in_stack_fffffffffffffaf4))),
                     in_stack_fffffffffffffaf0);
      local_3b0.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                              CONCAT15(in_stack_fffffffffffffaf5,
                                                       CONCAT14(in_stack_fffffffffffffaf4,
                                                                in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      local_3ac.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i =
           (QFlagsStorage<QOpenGLExtensions::OpenGLExtension>)
           QFlags<QOpenGLExtensions::OpenGLExtension>::operator|
                     ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
                      CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                              CONCAT15(in_stack_fffffffffffffaf5,
                                                       CONCAT14(in_stack_fffffffffffffaf4,
                                                                in_stack_fffffffffffffaf0)))),
                      in_stack_fffffffffffffaec);
      IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3ac);
      local_4cc = IVar2 | local_4cc;
    }
    local_408 = QSurfaceFormat::version
                          ((QSurfaceFormat *)
                           CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                   CONCAT15(in_stack_fffffffffffffaf5,
                                                            CONCAT14(in_stack_fffffffffffffaf4,
                                                                     in_stack_fffffffffffffaf0)))));
    local_418[1] = 3;
    local_418[0] = 2;
    std::pair<int,_int>::pair<int,_int,_true>(&local_410,local_418 + 1,local_418);
    bVar1 = std::operator>=((pair<int,_int> *)
                            CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                    CONCAT15(in_stack_fffffffffffffaf5,
                                                             CONCAT14(in_stack_fffffffffffffaf4,
                                                                      in_stack_fffffffffffffaf0)))),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    bVar5 = 1;
    if (!bVar1) {
      QByteArray::QByteArray(&local_430,"GL_ARB_geometry_shader4",-1);
      bVar5 = QOpenGLExtensionMatcher::match
                        ((QOpenGLExtensionMatcher *)
                         CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                 CONCAT15(in_stack_fffffffffffffaf5,
                                                          CONCAT14(in_stack_fffffffffffffaf4,
                                                                   in_stack_fffffffffffffaf0)))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
      QByteArray::~QByteArray((QByteArray *)0x90e52c);
    }
    if ((bVar5 & 1) != 0) {
      local_4cc = local_4cc | 0x80000;
    }
    local_438 = QSurfaceFormat::version
                          ((QSurfaceFormat *)
                           CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                   CONCAT15(in_stack_fffffffffffffaf5,
                                                            CONCAT14(in_stack_fffffffffffffaf4,
                                                                     in_stack_fffffffffffffaf0)))));
    local_448[1] = 3;
    local_448[0] = 3;
    std::pair<int,_int>::pair<int,_int,_true>(&local_440,local_448 + 1,local_448);
    bVar1 = std::operator>=((pair<int,_int> *)
                            CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                    CONCAT15(in_stack_fffffffffffffaf5,
                                                             CONCAT14(in_stack_fffffffffffffaf4,
                                                                      in_stack_fffffffffffffaf0)))),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (bVar1) {
      local_4cc = local_4cc | 0x1000000;
    }
    local_450 = QSurfaceFormat::version
                          ((QSurfaceFormat *)
                           CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                   CONCAT15(in_stack_fffffffffffffaf5,
                                                            CONCAT14(in_stack_fffffffffffffaf4,
                                                                     in_stack_fffffffffffffaf0)))));
    local_460[1] = 4;
    local_460[0] = 3;
    std::pair<int,_int>::pair<int,_int,_true>(&local_458,local_460 + 1,local_460);
    bVar1 = std::operator>=((pair<int,_int> *)
                            CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                                    CONCAT15(in_stack_fffffffffffffaf5,
                                                             CONCAT14(in_stack_fffffffffffffaf4,
                                                                      in_stack_fffffffffffffaf0)))),
                            (pair<int,_int> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    in_stack_fffffffffffffaf7 = 1;
    if (!bVar1) {
      QByteArray::QByteArray(&local_478,"GL_ARB_invalidate_subdata",-1);
      in_stack_fffffffffffffaf7 =
           QOpenGLExtensionMatcher::match
                     ((QOpenGLExtensionMatcher *)
                      CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffaf6,
                                              CONCAT15(in_stack_fffffffffffffaf5,
                                                       CONCAT14(in_stack_fffffffffffffaf4,
                                                                in_stack_fffffffffffffaf0)))),
                      (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      QByteArray::~QByteArray((QByteArray *)0x90e679);
    }
    if ((in_stack_fffffffffffffaf7 & 1) != 0) {
      local_4cc = local_4cc | 0x400000;
    }
    QByteArray::QByteArray(&local_490,"GL_ARB_map_buffer_range",-1);
    in_stack_fffffffffffffaf6 =
         QOpenGLExtensionMatcher::match
                   ((QOpenGLExtensionMatcher *)
                    CONCAT17(in_stack_fffffffffffffaf7,
                             CONCAT16(in_stack_fffffffffffffaf6,
                                      CONCAT15(in_stack_fffffffffffffaf5,
                                               CONCAT14(in_stack_fffffffffffffaf4,
                                                        in_stack_fffffffffffffaf0)))),
                    (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90e6d1);
    if ((in_stack_fffffffffffffaf6 & 1) != 0) {
      local_4cc = local_4cc | 0x100000;
    }
    QByteArray::QByteArray(&local_4a8,"GL_EXT_framebuffer_sRGB",-1);
    in_stack_fffffffffffffaf5 =
         QOpenGLExtensionMatcher::match
                   ((QOpenGLExtensionMatcher *)
                    CONCAT17(in_stack_fffffffffffffaf7,
                             CONCAT16(in_stack_fffffffffffffaf6,
                                      CONCAT15(in_stack_fffffffffffffaf5,
                                               CONCAT14(in_stack_fffffffffffffaf4,
                                                        in_stack_fffffffffffffaf0)))),
                    (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90e720);
    if ((in_stack_fffffffffffffaf5 & 1) != 0) {
      QOpenGLContext::functions
                ((QOpenGLContext *)
                 CONCAT17(in_stack_fffffffffffffaf7,
                          CONCAT16(in_stack_fffffffffffffaf6,
                                   CONCAT15(in_stack_fffffffffffffaf5,
                                            CONCAT14(in_stack_fffffffffffffaf4,
                                                     in_stack_fffffffffffffaf0)))));
      QOpenGLFunctions::glGetBooleanv
                ((QOpenGLFunctions *)
                 CONCAT17(in_stack_fffffffffffffaf7,
                          CONCAT16(in_stack_fffffffffffffaf6,
                                   CONCAT15(in_stack_fffffffffffffaf5,
                                            CONCAT14(in_stack_fffffffffffffaf4,
                                                     in_stack_fffffffffffffaf0)))),
                 in_stack_fffffffffffffaec,(GLboolean *)0x90e74b);
    }
    QByteArray::QByteArray((QByteArray *)&stack0xfffffffffffffb38,"GL_ARB_ES3_compatibility",-1);
    in_stack_fffffffffffffaf4 =
         QOpenGLExtensionMatcher::match
                   ((QOpenGLExtensionMatcher *)
                    CONCAT17(in_stack_fffffffffffffaf7,
                             CONCAT16(in_stack_fffffffffffffaf6,
                                      CONCAT15(in_stack_fffffffffffffaf5,
                                               CONCAT14(in_stack_fffffffffffffaf4,
                                                        in_stack_fffffffffffffaf0)))),
                    (QByteArray *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QByteArray::~QByteArray((QByteArray *)0x90e799);
    if ((in_stack_fffffffffffffaf4 & 1) != 0) {
      local_4cc = local_4cc | 0x8000000;
    }
  }
  QSurfaceFormat::~QSurfaceFormat
            ((QSurfaceFormat *)
             CONCAT17(in_stack_fffffffffffffaf7,
                      CONCAT16(in_stack_fffffffffffffaf6,
                               CONCAT15(in_stack_fffffffffffffaf5,
                                        CONCAT14(in_stack_fffffffffffffaf4,local_4cc)))));
  QOpenGLExtensionMatcher::~QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)0x90e7d4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4cc;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_gl_resolve_extensions()
{
    int extensions = 0;
    QOpenGLExtensionMatcher extensionMatcher;
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QSurfaceFormat format = ctx->format();

    if (extensionMatcher.match("GL_EXT_bgra"))
        extensions |= QOpenGLExtensions::BGRATextureFormat;
    if (extensionMatcher.match("GL_ARB_texture_rectangle"))
        extensions |= QOpenGLExtensions::TextureRectangle;
    if (extensionMatcher.match("GL_ARB_texture_compression"))
        extensions |= QOpenGLExtensions::TextureCompression;
    if (extensionMatcher.match("GL_EXT_texture_compression_s3tc"))
        extensions |= QOpenGLExtensions::DDSTextureCompression;
    if (extensionMatcher.match("GL_OES_compressed_ETC1_RGB8_texture"))
        extensions |= QOpenGLExtensions::ETC1TextureCompression;
    if (extensionMatcher.match("GL_IMG_texture_compression_pvrtc"))
        extensions |= QOpenGLExtensions::PVRTCTextureCompression;
    if (extensionMatcher.match("GL_KHR_texture_compression_astc_ldr"))
        extensions |= QOpenGLExtensions::ASTCTextureCompression;
    if (extensionMatcher.match("GL_ARB_texture_mirrored_repeat"))
        extensions |= QOpenGLExtensions::MirroredRepeat;
    if (extensionMatcher.match("GL_EXT_stencil_two_side"))
        extensions |= QOpenGLExtensions::StencilTwoSide;
    if (extensionMatcher.match("GL_EXT_stencil_wrap"))
        extensions |= QOpenGLExtensions::StencilWrap;
    if (extensionMatcher.match("GL_NV_float_buffer"))
        extensions |= QOpenGLExtensions::NVFloatBuffer;
    if (extensionMatcher.match("GL_ARB_pixel_buffer_object"))
        extensions |= QOpenGLExtensions::PixelBufferObject;
    if (extensionMatcher.match("GL_ARB_texture_swizzle") || extensionMatcher.match("GL_EXT_texture_swizzle"))
        extensions |= QOpenGLExtensions::TextureSwizzle;
    if (extensionMatcher.match("GL_OES_standard_derivatives"))
        extensions |= QOpenGLExtensions::StandardDerivatives;
    if (extensionMatcher.match("GL_ARB_half_float_vertex"))
        extensions |= QOpenGLExtensions::HalfFloatVertex;
    if (extensionMatcher.match("GL_OVR_multiview"))
        extensions |= QOpenGLExtensions::MultiView;
    if (extensionMatcher.match("GL_OVR_multiview2"))
        extensions |= QOpenGLExtensions::MultiViewExtended;

    if (ctx->isOpenGLES()) {
        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 3) {
            extensions |= QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Depth24
                | QOpenGLExtensions::ElementIndexUint
                | QOpenGLExtensions::MapBufferRange
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::Sized8Formats
                | QOpenGLExtensions::DiscardFramebuffer
                | QOpenGLExtensions::StandardDerivatives
                | QOpenGLExtensions::ETC2TextureCompression
                | QOpenGLExtensions::HalfFloatVertex;
#ifndef Q_OS_WASM
            // WebGL 2.0 specification explicitly does not support texture swizzles
            // https://registry.khronos.org/webgl/specs/latest/2.0/#5.19
            extensions |= QOpenGLExtensions::TextureSwizzle;
#endif
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_OES_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
            if (extensionMatcher.match("GL_OES_depth24"))
                extensions |= QOpenGLExtensions::Depth24;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_NV_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_NV_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_OES_rgb8_rgba8"))
                extensions |= QOpenGLExtensions::Sized8Formats;
            if (extensionMatcher.match("GL_OES_compressed_ETC2_RGB8_texture"))
                extensions |= QOpenGLExtensions::ETC2TextureCompression;
        }

        if (extensionMatcher.match("GL_OES_mapbuffer"))
            extensions |= QOpenGLExtensions::MapBuffer;
        if (extensionMatcher.match("GL_OES_element_index_uint"))
            extensions |= QOpenGLExtensions::ElementIndexUint;
        // We don't match GL_APPLE_texture_format_BGRA8888 here because it has different semantics.
        if (extensionMatcher.match("GL_IMG_texture_format_BGRA8888") || extensionMatcher.match("GL_EXT_texture_format_BGRA8888"))
            extensions |= QOpenGLExtensions::BGRATextureFormat;
#ifdef Q_OS_ANDROID
        QString *deviceName =
                static_cast<QString *>(QGuiApplication::platformNativeInterface()->nativeResourceForIntegration("AndroidDeviceName"));
        static bool wrongfullyReportsBgra8888Support = deviceName != 0
                                                        && (deviceName->compare("samsung SM-T211"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T210"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T215"_L1, Qt::CaseInsensitive) == 0);
        if (wrongfullyReportsBgra8888Support)
            extensions &= ~QOpenGLExtensions::BGRATextureFormat;
#endif

        if (extensionMatcher.match("GL_EXT_discard_framebuffer"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;
        if (extensionMatcher.match("GL_EXT_texture_norm16"))
            extensions |= QOpenGLExtensions::Sized16Formats;
    } else {
        extensions |= QOpenGLExtensions::ElementIndexUint
            | QOpenGLExtensions::MapBuffer
            | QOpenGLExtensions::Sized16Formats;

        if (format.version() >= std::pair(1, 2))
            extensions |= QOpenGLExtensions::BGRATextureFormat;

        if (format.version() >= std::pair(1, 4) || extensionMatcher.match("GL_SGIS_generate_mipmap"))
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::StandardDerivatives;

        if (format.majorVersion() >= 3 || extensionMatcher.match("GL_ARB_framebuffer_object")) {
            extensions |= QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Sized8Formats;
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_EXT_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_EXT_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_EXT_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
        }

        if (format.version() >= std::pair(3, 2) || extensionMatcher.match("GL_ARB_geometry_shader4"))
            extensions |= QOpenGLExtensions::GeometryShaders;

        if (format.version() >= std::pair(3, 3))
            extensions |= QOpenGLExtensions::TextureSwizzle;

        if (format.version() >= std::pair(4, 3) || extensionMatcher.match("GL_ARB_invalidate_subdata"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;

        if (extensionMatcher.match("GL_ARB_map_buffer_range"))
            extensions |= QOpenGLExtensions::MapBufferRange;

        if (extensionMatcher.match("GL_EXT_framebuffer_sRGB")) {
            GLboolean srgbCapableFramebuffers = false;
            ctx->functions()->glGetBooleanv(GL_FRAMEBUFFER_SRGB_CAPABLE_EXT, &srgbCapableFramebuffers);
            if (srgbCapableFramebuffers)
                extensions |= QOpenGLExtensions::SRGBFrameBuffer;
        }

        if (extensionMatcher.match("GL_ARB_ES3_compatibility"))
            extensions |= QOpenGLExtensions::ETC2TextureCompression;
    }

    return extensions;
}